

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

void __thiscall xray_re::xr_ini_file::ini_section::~ini_section(ini_section *this)

{
  pointer ppiVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  delete_elements<std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
            (&this->items);
  ppiVar1 = (this->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppiVar1 != (pointer)0x0) {
    operator_delete(ppiVar1,(long)(this->items).
                                  super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppiVar1
                   );
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar3 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

xr_ini_file::ini_section::~ini_section()
{
	delete_elements(items);
}